

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O0

void __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::destroy_pipeline(ConvolutionDepthWise_x86_avx512 *this)

{
  Option *in_stack_00000028;
  ConvolutionDepthWise_x86_avx512 *in_stack_00000030;
  
  destroy_pipeline(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    for (int i = 0; i < (int)group_ops.size(); i++)
    {
        group_ops[i]->destroy_pipeline(opt);
        delete group_ops[i];
    }
    group_ops.clear();

    return 0;
}